

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_demon.cpp
# Opt level: O2

int AF_A_SargAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  int iVar4;
  AActor *pAVar5;
  AActor *self;
  char *__assertion;
  DAngle angle;
  FName local_24;
  undefined8 local_20;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0051f69e;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_0051f574:
        self = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0051f69e;
        }
      }
      if (numparam == 1) goto LAB_0051f5f4;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0051f68e;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0051f69e;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0051f68e;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0051f5f4:
        obj = &self->target;
        pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar5 != (AActor *)0x0) {
          A_FaceTarget(self);
          bVar2 = AActor::CheckMeleeRange(self);
          if (bVar2) {
            iVar3 = FRandom::operator()(&pr_sargattack);
            iVar3 = (iVar3 % 10) * 4 + 4;
            pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
            local_24.Index = 0x84;
            local_20 = 0;
            iVar4 = P_DamageMobj(pAVar5,self,self,iVar3,&local_24,0,angle);
            if (0 < iVar4) {
              iVar3 = iVar4;
            }
            pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
            P_TraceBleed(iVar3,pAVar5,self);
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0051f69e;
    }
    if (self == (AActor *)0x0) goto LAB_0051f574;
  }
LAB_0051f68e:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0051f69e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_demon.cpp"
                ,0x10,"int AF_A_SargAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SargAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		int damage = ((pr_sargattack()%10)+1)*4;
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	return 0;
}